

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_fwd_txfm_sse4.c
# Opt level: O2

void av1_fwd_txfm2d_64x32_sse4_1(int16_t *input,int32_t *coeff,int stride,TX_TYPE tx_type,int bd)

{
  int8_t *piVar1;
  long lVar2;
  __m128i *input_00;
  ulong uVar3;
  int shift;
  __m128i in [512];
  
  piVar1 = av1_fwd_txfm_shift_ls[0xc];
  uVar3 = (ulong)(uint)bd;
  for (lVar2 = 0; lVar2 != 0x2000; lVar2 = lVar2 + 0x100) {
    shift = (int)*piVar1;
    load_buffer_4x4(input,(__m128i *)((long)in[0] + lVar2),4,0,0,shift);
    load_buffer_4x4(input + 0x10,(__m128i *)((long)in[4] + lVar2),4,0,0,shift);
    load_buffer_4x4(input + 0x20,(__m128i *)((long)in[8] + lVar2),4,0,0,shift);
    uVar3 = 0;
    load_buffer_4x4(input + 0x30,(__m128i *)((long)in[0xc] + lVar2),4,0,0,shift);
    input = input + stride;
  }
  for (lVar2 = 0; lVar2 != 0x100; lVar2 = lVar2 + 0x10) {
    input_00 = (__m128i *)((long)in[0] + lVar2);
    av1_fdct32_sse4_1(input_00,input_00,0xc,0x10);
  }
  for (lVar2 = 0; lVar2 != 0x2000; lVar2 = lVar2 + 0x400) {
    col_txfm_16x16_rounding((__m128i *)((long)in[0] + lVar2),-(int)piVar1[1]);
  }
  transpose_8nx8n(in,(__m128i *)coeff,0x40,0x20);
  for (lVar2 = 0; lVar2 != 0x80; lVar2 = lVar2 + 0x10) {
    uVar3 = 8;
    av1_fdct64_sse4_1((__m128i *)((long)coeff + lVar2),(__m128i *)((long)in[0] + lVar2),'\v',8,8);
  }
  av1_round_shift_rect_array_32_sse4_1(in,(__m128i *)coeff,0x200,-(int)piVar1[2],(int)uVar3);
  return;
}

Assistant:

void av1_fwd_txfm2d_64x32_sse4_1(const int16_t *input, int32_t *coeff,
                                 int stride, TX_TYPE tx_type, int bd) {
  (void)tx_type;
  __m128i in[512];
  __m128i *outcoef128 = (__m128i *)coeff;
  const int8_t *shift = av1_fwd_txfm_shift_ls[TX_64X32];
  const int txw_idx = get_txw_idx(TX_64X32);
  const int txh_idx = get_txh_idx(TX_64X32);
  const int txfm_size_col = tx_size_wide[TX_64X32];
  const int txfm_size_row = tx_size_high[TX_64X32];
  int bitcol = av1_fwd_cos_bit_col[txw_idx][txh_idx];
  int bitrow = av1_fwd_cos_bit_row[txw_idx][txh_idx];
  const int num_row = txfm_size_row >> 2;
  const int num_col = txfm_size_col >> 2;

  // column transform
  for (int i = 0; i < 32; i++) {
    load_buffer_4x4(input + 0 + i * stride, in + 0 + i * 16, 4, 0, 0, shift[0]);
    load_buffer_4x4(input + 16 + i * stride, in + 4 + i * 16, 4, 0, 0,
                    shift[0]);
    load_buffer_4x4(input + 32 + i * stride, in + 8 + i * 16, 4, 0, 0,
                    shift[0]);
    load_buffer_4x4(input + 48 + i * stride, in + 12 + i * 16, 4, 0, 0,
                    shift[0]);
  }

  for (int i = 0; i < num_col; i++) {
    av1_fdct32_sse4_1((in + i), (in + i), bitcol, num_col);
  }

  for (int i = 0; i < num_row; i++) {
    col_txfm_16x16_rounding((in + i * txfm_size_col), -shift[1]);
  }
  transpose_8nx8n(in, outcoef128, txfm_size_col, txfm_size_row);

  // row transform
  for (int i = 0; i < num_row; i++) {
    av1_fdct64_sse4_1((outcoef128 + i), (in + i), bitrow, num_row, num_row);
  }
  av1_round_shift_rect_array_32_sse4_1(in, outcoef128, 512, -shift[2],
                                       NewSqrt2);
  (void)bd;
}